

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAT2FO.cpp
# Opt level: O2

void __thiscall SAT::SAT2FO::collectAssignment(SAT2FO *this,SATSolver *solver,LiteralStack *res)

{
  int iVar1;
  Literal *elem;
  uint i;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  uVar2 = (this->_posMap)._nextNum;
  uVar3 = uVar2 - 1;
  if (uVar2 == 0) {
    uVar3 = 0;
  }
  iVar4 = 2;
  for (uVar2 = 1; uVar2 <= uVar3; uVar2 = uVar2 + 1) {
    iVar1 = (*solver->_vptr_SATSolver[6])(solver,(ulong)uVar2);
    if (iVar1 != 2) {
      elem = toFO(this,(SATLiteral)(iVar4 + (uint)(iVar1 == 0)));
      if (elem != (Literal *)0x0) {
        Lib::Stack<Kernel::Literal_*>::push(res,elem);
      }
    }
    iVar4 = iVar4 + 2;
  }
  return;
}

Assistant:

void SAT2FO::collectAssignment(SATSolver& solver, LiteralStack& res) const
{
  // ASS_EQ(solver.getStatus(), SATSolver::SATISFIABLE);
  ASS(res.isEmpty());

  unsigned maxVar = maxSATVar();
  for (unsigned i = 1; i <= maxVar; i++) {
    SATSolver::VarAssignment asgn = solver.getAssignment(i);
    if(asgn==SATSolver::VarAssignment::DONT_CARE) {
      //we don't add DONT_CARE literals into the assignment
      continue;
    }
    ASS(asgn==SATSolver::VarAssignment::TRUE || asgn==SATSolver::VarAssignment::FALSE);
    SATLiteral sl(i, asgn==SATSolver::VarAssignment::TRUE);
    ASS(solver.trueInAssignment(sl));
    Literal* lit = toFO(sl);
    if(!lit) {
      //SAT literal doesn't have corresponding FO one
      continue;
    }
    res.push(lit);
  }
}